

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O0

bool __thiscall
NJamSpell::TSpellCorrector::TrainLangModel
          (TSpellCorrector *this,string *textFile,string *alphabetFile,string *modelFile)

{
  bool bVar1;
  undefined1 local_50 [8];
  string cacheFile;
  string *modelFile_local;
  string *alphabetFile_local;
  string *textFile_local;
  TSpellCorrector *this_local;
  
  cacheFile.field_2._8_8_ = modelFile;
  bVar1 = TLangModel::Train(&this->LangModel,textFile,alphabetFile);
  if (bVar1) {
    PrepareCache(this);
    bVar1 = TLangModel::Dump(&this->LangModel,(string *)cacheFile.field_2._8_8_);
    if (bVar1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     cacheFile.field_2._8_8_,".spell");
      this_local._7_1_ =
           SaveCache(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_50);
      std::__cxx11::string::~string((string *)local_50);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool TSpellCorrector::TrainLangModel(const std::string& textFile, const std::string& alphabetFile, const std::string& modelFile) {
    if (!LangModel.Train(textFile, alphabetFile)) {
        return false;
    }
    PrepareCache();
    if (!LangModel.Dump(modelFile)) {
        return false;
    }
    std::string cacheFile = modelFile + ".spell";
    if (!SaveCache(cacheFile)) {
        return false;
    }
    return true;
}